

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O0

void lws_accept_modulation(lws_context *context,lws_context_per_thread *pt,int allow)

{
  lws *wsi;
  lws_dll2 *d;
  lws_pollargs pa1;
  lws_vhost *vh;
  int allow_local;
  lws_context_per_thread *pt_local;
  lws_context *context_local;
  
  for (pa1._4_8_ = context->vhost_list; pa1._4_8_ != 0;
      pa1._4_8_ = *(undefined8 *)(pa1._4_8_ + 0x1e8)) {
    for (wsi = (lws *)lws_dll2_get_head((lws_dll2_owner *)(pa1._4_8_ + 0x1f8)); wsi != (lws *)0x0;
        wsi = (lws *)(wsi->a).vhost) {
      _lws_change_pollfd((lws *)&wsi[-1].sul_connect_timeout.list.owner,(uint)(allow == 0),
                         (uint)(allow != 0),(lws_pollargs *)((long)&d + 4));
    }
  }
  return;
}

Assistant:

static void
lws_accept_modulation(struct lws_context *context,
		      struct lws_context_per_thread *pt, int allow)
{
	struct lws_vhost *vh = context->vhost_list;
	struct lws_pollargs pa1;

	while (vh) {
		lws_start_foreach_dll(struct lws_dll2 *, d,
				      lws_dll2_get_head(&vh->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			_lws_change_pollfd(wsi, allow ? 0 : LWS_POLLIN,
						allow ? LWS_POLLIN : 0, &pa1);
		} lws_end_foreach_dll(d);

		vh = vh->vhost_next;
	}
}